

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000002b5ee0 = 0x2d2d2d2d2d2d2d;
    uRam00000000002b5ee7._0_1_ = '-';
    uRam00000000002b5ee7._1_1_ = '-';
    uRam00000000002b5ee7._2_1_ = '-';
    uRam00000000002b5ee7._3_1_ = '-';
    uRam00000000002b5ee7._4_1_ = '-';
    uRam00000000002b5ee7._5_1_ = '-';
    uRam00000000002b5ee7._6_1_ = '-';
    uRam00000000002b5ee7._7_1_ = '-';
    DAT_002b5ed0 = '-';
    DAT_002b5ed0_1._0_1_ = '-';
    DAT_002b5ed0_1._1_1_ = '-';
    DAT_002b5ed0_1._2_1_ = '-';
    DAT_002b5ed0_1._3_1_ = '-';
    DAT_002b5ed0_1._4_1_ = '-';
    DAT_002b5ed0_1._5_1_ = '-';
    DAT_002b5ed0_1._6_1_ = '-';
    uRam00000000002b5ed8 = 0x2d2d2d2d2d2d2d;
    DAT_002b5edf = 0x2d;
    DAT_002b5ec0 = '-';
    DAT_002b5ec0_1._0_1_ = '-';
    DAT_002b5ec0_1._1_1_ = '-';
    DAT_002b5ec0_1._2_1_ = '-';
    DAT_002b5ec0_1._3_1_ = '-';
    DAT_002b5ec0_1._4_1_ = '-';
    DAT_002b5ec0_1._5_1_ = '-';
    DAT_002b5ec0_1._6_1_ = '-';
    uRam00000000002b5ec8._0_1_ = '-';
    uRam00000000002b5ec8._1_1_ = '-';
    uRam00000000002b5ec8._2_1_ = '-';
    uRam00000000002b5ec8._3_1_ = '-';
    uRam00000000002b5ec8._4_1_ = '-';
    uRam00000000002b5ec8._5_1_ = '-';
    uRam00000000002b5ec8._6_1_ = '-';
    uRam00000000002b5ec8._7_1_ = '-';
    DAT_002b5eb0 = '-';
    DAT_002b5eb0_1._0_1_ = '-';
    DAT_002b5eb0_1._1_1_ = '-';
    DAT_002b5eb0_1._2_1_ = '-';
    DAT_002b5eb0_1._3_1_ = '-';
    DAT_002b5eb0_1._4_1_ = '-';
    DAT_002b5eb0_1._5_1_ = '-';
    DAT_002b5eb0_1._6_1_ = '-';
    uRam00000000002b5eb8._0_1_ = '-';
    uRam00000000002b5eb8._1_1_ = '-';
    uRam00000000002b5eb8._2_1_ = '-';
    uRam00000000002b5eb8._3_1_ = '-';
    uRam00000000002b5eb8._4_1_ = '-';
    uRam00000000002b5eb8._5_1_ = '-';
    uRam00000000002b5eb8._6_1_ = '-';
    uRam00000000002b5eb8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000002b5ea8._0_1_ = '-';
    uRam00000000002b5ea8._1_1_ = '-';
    uRam00000000002b5ea8._2_1_ = '-';
    uRam00000000002b5ea8._3_1_ = '-';
    uRam00000000002b5ea8._4_1_ = '-';
    uRam00000000002b5ea8._5_1_ = '-';
    uRam00000000002b5ea8._6_1_ = '-';
    uRam00000000002b5ea8._7_1_ = '-';
    DAT_002b5eef = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}